

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QSimplexConstraint_*>::relocate
          (QArrayDataPointer<QSimplexConstraint_*> *this,qsizetype offset,QSimplexConstraint ***data
          )

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QSimplexConstraint_*> *in_RDI;
  QSimplexConstraint ***unaff_retaddr;
  QSimplexConstraint **res;
  QSimplexConstraint **first;
  QArrayDataPointer<QSimplexConstraint_*> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QSimplexConstraint*,long_long>
            (first,(longlong)in_RDI,(QSimplexConstraint **)0x953ee7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QSimplexConstraint*>,QSimplexConstraint*const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }